

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

path * GetSnapshotCoinsDBPath(Chainstate *cs)

{
  long lVar1;
  bool bVar2;
  Chainstate *in_RDI;
  long in_FS_OFFSET;
  optional<fs::path> storage_path_maybe;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  CCoinsViewDB *in_stack_ffffffffffffff90;
  Chainstate *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
             (AnnotatedMixin<std::recursive_mutex> *)0x14b0418);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<uint256> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (!bVar2) {
    __assert_fail("cs.m_from_snapshot_blockhash",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x18a7,"fs::path GetSnapshotCoinsDBPath(Chainstate &)");
  }
  Chainstate::CoinsDB(this);
  CCoinsViewDB::StoragePath(in_stack_ffffffffffffff90);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<fs::path> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (!bVar2) {
    __assert_fail("storage_path_maybe",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x18aa,"fs::path GetSnapshotCoinsDBPath(Chainstate &)");
  }
  std::optional<fs::path>::operator*
            ((optional<fs::path> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  fs::path::path((path *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (path *)0x14b04ac);
  std::optional<fs::path>::~optional
            ((optional<fs::path> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (path *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    AssertLockHeld(::cs_main);
    // Should never be called on a non-snapshot chainstate.
    assert(cs.m_from_snapshot_blockhash);
    auto storage_path_maybe = cs.CoinsDB().StoragePath();
    // Should never be called with a non-existent storage path.
    assert(storage_path_maybe);
    return *storage_path_maybe;
}